

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Status SVar6;
  unsigned_long uVar7;
  char *pcVar8;
  undefined8 uVar9;
  unsigned_long dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory d;
  string next;
  Directory local_b0;
  string local_a8;
  string local_88;
  char *local_58;
  string local_50;
  
  if ((*path == '.') && (path[1] == '\0')) {
    iVar5 = std::__cxx11::string::compare((char *)&this->Format);
    if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&this->Format), iVar5 == 0))
    goto LAB_0011c814;
  }
  bVar3 = AddFile(this,path,skip,prefix);
  if (!bVar3) {
    return false;
  }
LAB_0011c814:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,path,(allocator<char> *)&local_a8);
  bVar3 = cmsys::SystemTools::FileIsDirectory(&local_88);
  bVar4 = true;
  if (bVar3 && recursive) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,path,(allocator<char> *)&local_b0);
    bVar4 = cmsys::SystemTools::FileIsSymlink(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_88.field_2;
  local_58 = prefix;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  bVar3 = true;
  if (bVar4 == false) {
    cmsys::Directory::Directory(&local_b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,path,(allocator<char> *)&local_50);
    SVar6 = cmsys::Directory::Load(&local_b0,&local_88,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    bVar3 = true;
    if (SVar6.Kind_ == Success) {
      local_50._M_dataplus._M_p = (pointer)strlen(path);
      local_88._M_dataplus._M_p = (pointer)0x1;
      local_88.field_2._M_local_buf[0] = '/';
      local_50.field_2._M_allocated_capacity = 1;
      views._M_len = 2;
      views._M_array = (iterator)&local_50;
      local_88._M_string_length = (size_type)paVar1;
      local_50._M_string_length = (size_type)path;
      local_50.field_2._8_8_ = paVar1;
      cmCatViews_abi_cxx11_(&local_a8,views);
      iVar5 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar5 == 0) {
        iVar5 = std::__cxx11::string::compare((char *)&this->Format);
        if ((iVar5 == 0) ||
           (iVar5 = std::__cxx11::string::compare((char *)&this->Format), iVar5 == 0)) {
          local_a8._M_string_length = 0;
          *local_a8._M_dataplus._M_p = '\0';
        }
      }
      sVar2 = local_a8._M_string_length;
      uVar7 = cmsys::Directory::GetNumberOfFiles(&local_b0);
      if (uVar7 != 0) {
        dindex = 0;
        do {
          pcVar8 = cmsys::Directory::GetFile(&local_b0,dindex);
          if ((*pcVar8 != '.') ||
             ((pcVar8[1] != '\0' && ((pcVar8[1] != '.' || (pcVar8[2] != '\0')))))) {
            if (local_a8._M_string_length < sVar2) {
              uVar9 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",sVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              cmsys::Directory::~Directory(&local_b0);
              _Unwind_Resume(uVar9);
            }
            local_a8._M_dataplus._M_p[sVar2] = '\0';
            local_a8._M_string_length = sVar2;
            std::__cxx11::string::append((char *)&local_a8);
            bVar4 = AddPath(this,local_a8._M_dataplus._M_p,skip,local_58,true);
            if (!bVar4) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = false;
              goto LAB_0011ca80;
            }
          }
          dindex = dindex + 1;
        } while (uVar7 != dindex);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
LAB_0011ca80:
    cmsys::Directory::~Directory(&local_b0);
  }
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (strcmp(path, ".") != 0 ||
      (this->Format != "zip" && this->Format != "7zip")) {
    if (!this->AddFile(path, skip, prefix)) {
      return false;
    }
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = cmStrCat(path, '/');
    if (next == "./" && (this->Format == "zip" || this->Format == "7zip")) {
      next.clear();
    }
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}